

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mpi_montmul(mbedtls_mpi *A,mbedtls_mpi *B,mbedtls_mpi *N,mbedtls_mpi_uint mm,mbedtls_mpi *T)

{
  ulong n_00;
  mbedtls_mpi_uint b;
  mbedtls_mpi_uint mVar1;
  mbedtls_mpi_uint mVar2;
  int iVar3;
  size_t local_70;
  mbedtls_mpi_uint *local_68;
  mbedtls_mpi_uint *d;
  mbedtls_mpi_uint u1;
  mbedtls_mpi_uint u0;
  size_t m;
  size_t n;
  size_t i;
  mbedtls_mpi *T_local;
  mbedtls_mpi_uint mm_local;
  mbedtls_mpi *N_local;
  mbedtls_mpi *B_local;
  mbedtls_mpi *A_local;
  
  if ((T->n < N->n + 1) || (T->p == (mbedtls_mpi_uint *)0x0)) {
    A_local._4_4_ = -4;
  }
  else {
    memset(T->p,0,T->n << 3);
    n_00 = N->n;
    local_70 = n_00;
    if (B->n < n_00) {
      local_70 = B->n;
    }
    local_68 = T->p;
    for (n = 0; n < n_00; n = n + 1) {
      b = A->p[n];
      mVar1 = *local_68;
      mVar2 = *B->p;
      mpi_mul_hlp(local_70,B->p,local_68,b);
      mpi_mul_hlp(n_00,N->p,local_68,(mVar1 + b * mVar2) * mm);
      *local_68 = b;
      local_68[n_00 + 2] = 0;
      local_68 = local_68 + 1;
    }
    memcpy(A->p,local_68,(n_00 + 1) * 8);
    iVar3 = mbedtls_mpi_cmp_abs(A,N);
    if (iVar3 < 0) {
      mpi_sub_hlp(n_00,A->p,T->p);
    }
    else {
      mpi_sub_hlp(n_00,N->p,A->p);
    }
    A_local._4_4_ = 0;
  }
  return A_local._4_4_;
}

Assistant:

static int mpi_montmul( mbedtls_mpi *A, const mbedtls_mpi *B, const mbedtls_mpi *N, mbedtls_mpi_uint mm,
                         const mbedtls_mpi *T )
{
    size_t i, n, m;
    mbedtls_mpi_uint u0, u1, *d;

    if( T->n < N->n + 1 || T->p == NULL )
        return( MBEDTLS_ERR_MPI_BAD_INPUT_DATA );

    memset( T->p, 0, T->n * ciL );

    d = T->p;
    n = N->n;
    m = ( B->n < n ) ? B->n : n;

    for( i = 0; i < n; i++ )
    {
        /*
         * T = (T + u0*B + u1*N) / 2^biL
         */
        u0 = A->p[i];
        u1 = ( d[0] + u0 * B->p[0] ) * mm;

        mpi_mul_hlp( m, B->p, d, u0 );
        mpi_mul_hlp( n, N->p, d, u1 );

        *d++ = u0; d[n + 1] = 0;
    }

    memcpy( A->p, d, ( n + 1 ) * ciL );

    if( mbedtls_mpi_cmp_abs( A, N ) >= 0 )
        mpi_sub_hlp( n, N->p, A->p );
    else
        /* prevent timing attacks */
        mpi_sub_hlp( n, A->p, T->p );

    return( 0 );
}